

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestTestMockPredicateBehavesCorrectly::RunImpl
          (TestTestMockPredicateBehavesCorrectly *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_f8 [2];
  TestDetails local_b8;
  undefined1 local_88 [8];
  Test fail;
  Test pass;
  RunTestIfNameIs predicate;
  TestTestMockPredicateBehavesCorrectly *this_local;
  
  RunTestIfNameIs::RunTestIfNameIs((RunTestIfNameIs *)&pass.m_timeConstraintExempt,"pass");
  UnitTest::Test::Test((Test *)&fail.m_timeConstraintExempt,"pass","DefaultSuite","",0);
  UnitTest::Test::Test((Test *)local_88,"fail","DefaultSuite","",0);
  bVar2 = RunTestIfNameIs::operator()
                    ((RunTestIfNameIs *)&pass.m_timeConstraintExempt,
                     (Test *)&fail.m_timeConstraintExempt);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b8,*ppTVar4,0x112);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b8,"predicate(&pass)");
  }
  bVar2 = RunTestIfNameIs::operator()
                    ((RunTestIfNameIs *)&pass.m_timeConstraintExempt,(Test *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)((bVar2 ^ 0xffU) & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_f8,*ppTVar4,0x113);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_f8,"!predicate(&fail)");
  }
  UnitTest::Test::~Test((Test *)local_88);
  UnitTest::Test::~Test((Test *)&fail.m_timeConstraintExempt);
  return;
}

Assistant:

TEST(TestMockPredicateBehavesCorrectly)
{
	RunTestIfNameIs predicate("pass");
	
	Test pass("pass");
	Test fail("fail");
	
	CHECK(predicate(&pass));
	CHECK(!predicate(&fail));	
}